

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

LogEst sqlite3LogEstFromDouble(double x)

{
  long lVar1;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  LogEst e;
  u64 a;
  undefined2 local_1a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (1.0 < in_XMM0_Qa) {
    if (2000000000.0 < in_XMM0_Qa) {
      local_1a = ((ushort)((ulong)in_XMM0_Qa >> 0x34) - 0x3fe) * 10;
    }
    else {
      local_1a = sqlite3LogEst((long)in_XMM0_Qa |
                               (long)(in_XMM0_Qa - 9.223372036854776e+18) & (long)in_XMM0_Qa >> 0x3f
                              );
    }
  }
  else {
    local_1a = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1a;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE LogEst sqlite3LogEstFromDouble(double x){
  u64 a;
  LogEst e;
  assert( sizeof(x)==8 && sizeof(a)==8 );
  if( x<=1 ) return 0;
  if( x<=2000000000 ) return sqlite3LogEst((u64)x);
  memcpy(&a, &x, 8);
  e = (a>>52) - 1022;
  return e*10;
}